

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderGetProgramiv3Test::deinitSPOs
          (GeometryShaderGetProgramiv3Test *this,bool release_all_SPOs)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_po_id != 0 && release_all_SPOs) {
    (**(code **)(lVar2 + 0x448))();
    this->m_fs_po_id = 0;
  }
  if (this->m_gs_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_gs_po_id = 0;
  }
  if (this->m_vs_po_id != 0 && release_all_SPOs) {
    (**(code **)(lVar2 + 0x448))();
    this->m_vs_po_id = 0;
  }
  return;
}

Assistant:

void GeometryShaderGetProgramiv3Test::deinitSPOs(bool release_all_SPOs)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_po_id != 0 && release_all_SPOs)
	{
		gl.deleteProgram(m_fs_po_id);

		m_fs_po_id = 0;
	}

	if (m_gs_po_id != 0)
	{
		gl.deleteProgram(m_gs_po_id);

		m_gs_po_id = 0;
	}

	if (m_vs_po_id != 0 && release_all_SPOs)
	{
		gl.deleteProgram(m_vs_po_id);

		m_vs_po_id = 0;
	}
}